

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseBox(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkBox)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  Abc_Obj_t *pAVar10;
  int local_544;
  int local_52c;
  int local_4fc;
  int local_4e4;
  int flag;
  int fQuit;
  int nLsb;
  int nMsb;
  int Limit;
  int Bit;
  int k;
  int i;
  int fFormalIsGiven;
  int fCompl;
  char Symbol;
  char *pWord;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNetActual;
  Vec_Ptr_t *vBundles;
  Ver_Bundle_t *pBundle;
  Ver_Stream_t *p;
  char Buffer [1000];
  Abc_Ntk_t *pNtkBox_local;
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  pBundle = (Ver_Bundle_t *)pMan->pReader;
  _fCompl = Ver_ParseGetName(pMan);
  if (_fCompl != (char *)0x0) {
    pWord = (char *)Abc_NtkCreateBlackbox(pNtk);
    (((Abc_Obj_t *)pWord)->field_5).pData = pNtkBox;
    Abc_ObjAssignName((Abc_Obj_t *)pWord,_fCompl,(char *)0x0);
    cVar2 = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
    if (cVar2 == '(') {
      Ver_ParseSkipComments(pMan);
      pNetActual = (Abc_Obj_t *)Vec_PtrAlloc(0x10);
      *(Abc_Obj_t **)(pWord + 0x40) = pNetActual;
      do {
        vBundles = (Vec_Ptr_t *)malloc(0x10);
        vBundles->nCap = 0;
        vBundles->nSize = 0;
        pVVar6 = Vec_PtrAlloc(4);
        vBundles->pArray = (void **)pVVar6;
        Vec_PtrPush((Vec_Ptr_t *)pNetActual,vBundles);
        k = 0;
        cVar2 = Ver_StreamScanChar((Ver_Stream_t *)pBundle);
        if (cVar2 == '.') {
          k = 1;
          cVar2 = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
          if (cVar2 != '.') {
            pcVar5 = Abc_ObjName((Abc_Obj_t *)pWord);
            sprintf(pMan->sError,"Cannot parse box %s (expected .).",pcVar5);
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
          _fCompl = Ver_ParseGetName(pMan);
          if (_fCompl == (char *)0x0) {
            return 0;
          }
          pcVar5 = Extra_UtilStrsav(_fCompl);
          *(char **)vBundles = pcVar5;
          cVar2 = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
          pcVar5 = _fCompl;
          if (cVar2 != '(') {
            pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
            sprintf(pMan->sError,
                    "Cannot formal parameter %s of box %s (expected opening parenthesis).",pcVar5,
                    pcVar7);
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
          Ver_ParseSkipComments(pMan);
        }
        fFormalIsGiven._3_1_ = Ver_StreamScanChar((Ver_Stream_t *)pBundle);
        if (fFormalIsGiven._3_1_ == '{') {
          Ver_StreamPopChar((Ver_Stream_t *)pBundle);
          Bit = 0;
          bVar1 = false;
          while( true ) {
            Ver_ParseSkipComments(pMan);
            pcVar5 = Ver_ParseGetName(pMan);
            if (pcVar5 == (char *)0x0) {
              return 0;
            }
            _fCompl = pcVar5;
            sVar8 = strlen(pcVar5);
            pcVar7 = _fCompl;
            if (pcVar5[sVar8 - 1] == '}') {
              sVar8 = strlen(_fCompl);
              pcVar7[sVar8 - 1] = '\0';
              bVar1 = true;
            }
            pcVar5 = _fCompl;
            if (*_fCompl == '\0') break;
            if ((*_fCompl < '1') || ('9' < *_fCompl)) {
              sVar8 = strlen(_fCompl);
              if ((pcVar5[sVar8 - 1] == ']') && (pMan->fNameLast == 0)) {
                Ver_ParseSignalSuffix(pMan,_fCompl,&fQuit,&flag);
              }
              else {
                Ver_ParseLookupSuffix(pMan,_fCompl,&fQuit,&flag);
              }
              if ((fQuit == -1) && (flag == -1)) {
                pNode = Ver_ParseFindNet(pNtk,_fCompl);
                if (pNode == (Abc_Obj_t *)0x0) {
                  iVar3 = strncmp(_fCompl,"Open_",5);
                  if ((iVar3 != 0) &&
                     (iVar3 = strncmp(_fCompl,"dct_unconnected",0xf), pcVar5 = _fCompl, iVar3 != 0))
                  {
                    pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
                    sprintf(pMan->sError,"Actual net \"%s\" is missing in box \"%s\".",pcVar5,pcVar7
                           );
                    Ver_ParsePrintErrorMessage(pMan);
                    return 0;
                  }
                  pNode = Abc_NtkCreateNet(pNtk);
                }
                Vec_PtrPush((Vec_Ptr_t *)vBundles->pArray,pNode);
                Bit = Bit + 1;
              }
              else {
                if ((fQuit < 0) || (flag < 0)) {
                  __assert_fail("nMsb >= 0 && nLsb >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verCore.c"
                                ,0x75e,"int Ver_ParseBox(Ver_Man_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
                }
                if (flag < fQuit) {
                  Limit = fQuit - flag;
                }
                else {
                  Limit = flag - fQuit;
                }
                local_4e4 = Limit + 1;
                nLsb = local_4e4;
                nMsb = fQuit;
                for (; -1 < Limit; Limit = Limit + -1) {
                  sprintf((char *)&p,"%s[%d]",_fCompl,(ulong)(uint)nMsb);
                  pNode = Ver_ParseFindNet(pNtk,(char *)&p);
                  if (pNode == (Abc_Obj_t *)0x0) {
                    iVar3 = strncmp(_fCompl,"Open_",5);
                    if ((iVar3 != 0) &&
                       (iVar3 = strncmp(_fCompl,"dct_unconnected",0xf), pcVar5 = _fCompl, iVar3 != 0
                       )) {
                      pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
                      sprintf(pMan->sError,"Actual net \"%s\" is missing in box \"%s\".",pcVar5,
                              pcVar7);
                      Ver_ParsePrintErrorMessage(pMan);
                      return 0;
                    }
                    pNode = Abc_NtkCreateNet(pNtk);
                  }
                  Vec_PtrPush((Vec_Ptr_t *)vBundles->pArray,pNode);
                  if (flag < fQuit) {
                    local_4fc = nMsb + -1;
                  }
                  else {
                    local_4fc = nMsb + 1;
                  }
                  nMsb = local_4fc;
                  Bit = Bit + 1;
                }
              }
            }
            else {
              iVar3 = Ver_ParseConstant(pMan,_fCompl);
              if (iVar3 == 0) {
                return 0;
              }
              for (Limit = 0; iVar3 = Limit, iVar4 = Vec_PtrSize(pMan->vNames), iVar3 < iVar4;
                  Limit = Limit + 1) {
                pvVar9 = Vec_PtrEntry(pMan->vNames,Limit);
                sprintf((char *)&p,"1\'b%d",(ulong)(pvVar9 != (void *)0x0));
                pNode = Ver_ParseFindNet(pNtk,(char *)&p);
                if (pNode == (Abc_Obj_t *)0x0) {
                  pcVar5 = Abc_ObjName((Abc_Obj_t *)pWord);
                  sprintf(pMan->sError,"Actual net \"%s\" is missing in gate \"%s\".",&p,pcVar5);
                  Ver_ParsePrintErrorMessage(pMan);
                  return 0;
                }
                Vec_PtrPush((Vec_Ptr_t *)vBundles->pArray,pNode);
                Bit = Bit + 1;
              }
            }
            if (bVar1) break;
            Ver_ParseSkipComments(pMan);
            fFormalIsGiven._3_1_ = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
            pcVar5 = _fCompl;
            if (fFormalIsGiven._3_1_ == '}') break;
            if (fFormalIsGiven._3_1_ != ',') {
              pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
              sprintf(pMan->sError,"Cannot parse formal parameter %s of gate %s (expected comma).",
                      pcVar5,pcVar7);
              Ver_ParsePrintErrorMessage(pMan);
              return 0;
            }
          }
        }
        else {
          _fCompl = Ver_ParseGetName(pMan);
          if (_fCompl == (char *)0x0) {
            return 0;
          }
          i = 0;
          if (*_fCompl == '\0') {
            pNode = Abc_NtkCreateNet(pNtk);
            pVVar6 = (Vec_Ptr_t *)vBundles->pArray;
            pAVar10 = Abc_ObjNotCond(pNode,i);
            Vec_PtrPush(pVVar6,pAVar10);
          }
          else {
            bVar1 = false;
            pNode = Ver_ParseFindNet(pNtk,_fCompl);
            if (pNode == (Abc_Obj_t *)0x0) {
              Ver_ParseLookupSuffix(pMan,_fCompl,&fQuit,&flag);
              if ((fQuit == -1) && (flag == -1)) {
                Ver_ParseSignalSuffix(pMan,_fCompl,&fQuit,&flag);
                if ((fQuit == -1) && (flag == -1)) {
                  iVar3 = strncmp(_fCompl,"Open_",5);
                  if ((iVar3 != 0) &&
                     (iVar3 = strncmp(_fCompl,"dct_unconnected",0xf), pcVar5 = _fCompl, iVar3 != 0))
                  {
                    pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
                    sprintf(pMan->sError,"Actual net \"%s\" is missing in box \"%s\".",pcVar5,pcVar7
                           );
                    Ver_ParsePrintErrorMessage(pMan);
                    return 0;
                  }
                  pNode = Abc_NtkCreateNet(pNtk);
                  Vec_PtrPush((Vec_Ptr_t *)vBundles->pArray,pNode);
                }
                else {
                  bVar1 = true;
                }
              }
              else {
                bVar1 = true;
              }
              if (bVar1) {
                if (flag < fQuit) {
                  Limit = fQuit - flag;
                }
                else {
                  Limit = flag - fQuit;
                }
                local_52c = Limit + 1;
                nLsb = local_52c;
                nMsb = fQuit;
                for (; -1 < Limit; Limit = Limit + -1) {
                  sprintf((char *)&p,"%s[%d]",_fCompl,(ulong)(uint)nMsb);
                  pNode = Ver_ParseFindNet(pNtk,(char *)&p);
                  if (pNode == (Abc_Obj_t *)0x0) {
                    iVar3 = strncmp(_fCompl,"Open_",5);
                    if ((iVar3 != 0) &&
                       (iVar3 = strncmp(_fCompl,"dct_unconnected",0xf), pcVar5 = _fCompl, iVar3 != 0
                       )) {
                      pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
                      sprintf(pMan->sError,"Actual net \"%s\" is missing in box \"%s\".",pcVar5,
                              pcVar7);
                      Ver_ParsePrintErrorMessage(pMan);
                      return 0;
                    }
                    pNode = Abc_NtkCreateNet(pNtk);
                  }
                  Vec_PtrPush((Vec_Ptr_t *)vBundles->pArray,pNode);
                  if (flag < fQuit) {
                    local_544 = nMsb + -1;
                  }
                  else {
                    local_544 = nMsb + 1;
                  }
                  nMsb = local_544;
                }
              }
            }
            else {
              pVVar6 = (Vec_Ptr_t *)vBundles->pArray;
              pAVar10 = Abc_ObjNotCond(pNode,i);
              Vec_PtrPush(pVVar6,pAVar10);
            }
          }
        }
        if (k != 0) {
          Ver_ParseSkipComments(pMan);
          cVar2 = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
          pcVar5 = _fCompl;
          if (cVar2 != ')') {
            pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
            sprintf(pMan->sError,
                    "Cannot parse formal parameter %s of box %s (expected closing parenthesis).",
                    pcVar5,pcVar7);
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
          Ver_ParseSkipComments(pMan);
        }
        fFormalIsGiven._3_1_ = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
        pcVar5 = _fCompl;
        if (fFormalIsGiven._3_1_ == ')') {
          Ver_ParseSkipComments(pMan);
          cVar2 = Ver_StreamPopChar((Ver_Stream_t *)pBundle);
          if (cVar2 == ';') {
            return 1;
          }
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pWord);
          sprintf(pMan->sError,"Cannot read box %s (expected closing semicolumn).",pcVar5);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        if (fFormalIsGiven._3_1_ != ',') {
          pcVar7 = Abc_ObjName((Abc_Obj_t *)pWord);
          sprintf(pMan->sError,"Cannot parse formal parameter %s of box %s (expected comma).",pcVar5
                  ,pcVar7);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        Ver_ParseSkipComments(pMan);
      } while( true );
    }
    pcVar5 = Abc_ObjName((Abc_Obj_t *)pWord);
    sprintf(pMan->sError,"Cannot parse box %s (expected opening parenthesis).",pcVar5);
    Ver_ParsePrintErrorMessage(pMan);
  }
  return 0;
}

Assistant:

int Ver_ParseBox( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkBox )
{
    char Buffer[1000];
    Ver_Stream_t * p = pMan->pReader;
    Ver_Bundle_t * pBundle;
    Vec_Ptr_t * vBundles;
    Abc_Obj_t * pNetActual; 
    Abc_Obj_t * pNode;
    char * pWord, Symbol;
    int fCompl, fFormalIsGiven;
    int i, k, Bit, Limit, nMsb, nLsb, fQuit, flag;

    // gate the name of the box
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;

    // create a box with this name
    pNode = Abc_NtkCreateBlackbox( pNtk );
    pNode->pData = pNtkBox;
    Abc_ObjAssignName( pNode, pWord, NULL );

    // continue parsing the box
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse box %s (expected opening parenthesis).", Abc_ObjName(pNode) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );
 
    // parse pairs of formal/actual inputs
    vBundles = Vec_PtrAlloc( 16 );
    pNode->pCopy = (Abc_Obj_t *)vBundles;
    while ( 1 )
    {
        // allocate the bundle (formal name + array of actual nets)
        pBundle = ABC_ALLOC( Ver_Bundle_t, 1 );
        pBundle->pNameFormal = NULL;
        pBundle->vNetsActual = Vec_PtrAlloc( 4 );
        Vec_PtrPush( vBundles, pBundle );

        // process one pair of formal/actual parameters
        fFormalIsGiven = 0;
        if ( Ver_StreamScanChar(p) == '.' )
        {
            fFormalIsGiven = 1;
            if ( Ver_StreamPopChar(p) != '.' )
            {
                sprintf( pMan->sError, "Cannot parse box %s (expected .).", Abc_ObjName(pNode) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // parse the formal name
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;

            // save the name
            pBundle->pNameFormal = Extra_UtilStrsav( pWord );

            // open the parenthesis
            if ( Ver_StreamPopChar(p) != '(' )
            {
                sprintf( pMan->sError, "Cannot formal parameter %s of box %s (expected opening parenthesis).", pWord, Abc_ObjName(pNode));
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            Ver_ParseSkipComments( pMan );
        }

        // check if this is the beginning of {} expression
        Symbol = Ver_StreamScanChar(p);

        // consider the case of vector-inputs
        if ( Symbol == '{' )
        {
            // skip this char
            Ver_StreamPopChar(p);

            // read actual names
            i = 0;
            fQuit = 0;
            while ( 1 )
            {
                // parse the formal name
                Ver_ParseSkipComments( pMan );
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;

                // check if the last char is a closing brace
                if ( pWord[strlen(pWord)-1] == '}' )
                {
                    pWord[strlen(pWord)-1] = 0;
                    fQuit = 1;
                }
                if ( pWord[0] == 0 )
                    break;

                // check for constant
                if ( pWord[0] >= '1' && pWord[0] <= '9' )
                {
                    if ( !Ver_ParseConstant( pMan, pWord ) )
                        return 0;
                    // add constant MSB to LSB
                    for ( k = 0; k < Vec_PtrSize(pMan->vNames); k++, i++ )
                    {
                        // get the actual net
                        sprintf( Buffer, "1\'b%d", (int)(Vec_PtrEntry(pMan->vNames,k) != NULL) );
                        pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                        if ( pNetActual == NULL )
                        {
                            sprintf( pMan->sError, "Actual net \"%s\" is missing in gate \"%s\".", Buffer, Abc_ObjName(pNode) );
                            Ver_ParsePrintErrorMessage( pMan );
                            return 0;
                        }
                        Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                    }
                }
                else
                {
                    // get the suffix of the form [m:n]
                    if ( pWord[strlen(pWord)-1] == ']' && !pMan->fNameLast )
                        Ver_ParseSignalSuffix( pMan, pWord, &nMsb, &nLsb );
                    else
                        Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb );

                    // generate signals
                    if ( nMsb == -1 && nLsb == -1 )
                    {
                        // get the actual net
                        pNetActual = Ver_ParseFindNet( pNtk, pWord );
                        if ( pNetActual == NULL )
                        {
                            if ( !strncmp(pWord, "Open_", 5) ||
                                !strncmp(pWord, "dct_unconnected", 15) ) 
                                pNetActual = Abc_NtkCreateNet( pNtk );
                            else
                            {
                                sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                Ver_ParsePrintErrorMessage( pMan );
                                return 0;
                            }
                        }
                        Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        i++;
                    }
                    else
                    {
                        // go from MSB to LSB
                        assert( nMsb >= 0 && nLsb >= 0 );
                        Limit = (nMsb > nLsb) ? nMsb - nLsb + 1: nLsb - nMsb + 1;  
                        for ( Bit = nMsb, k = Limit - 1; k >= 0; Bit = (nMsb > nLsb ? Bit - 1: Bit + 1), k--, i++ )
                        {
                            // get the actual net
                            sprintf( Buffer, "%s[%d]", pWord, Bit );
                            pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                            if ( pNetActual == NULL )
                            {
                                if ( !strncmp(pWord, "Open_", 5) ||
                                    !strncmp(pWord, "dct_unconnected", 15) ) 
                                    pNetActual = Abc_NtkCreateNet( pNtk );
                                else
                                {
                                    sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                    Ver_ParsePrintErrorMessage( pMan );
                                    return 0;
                                }
                            }
                            Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        }
                    }
                }

                if ( fQuit )
                    break;

                // skip comma
                Ver_ParseSkipComments( pMan );
                Symbol = Ver_StreamPopChar(p);
                if ( Symbol == '}' )
                    break;
                if ( Symbol != ',' )
                {
                    sprintf( pMan->sError, "Cannot parse formal parameter %s of gate %s (expected comma).", pWord, Abc_ObjName(pNode) );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
            }
        }
        else
        {
            // get the next word
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // consider the case of empty name
            fCompl = 0;
            if ( pWord[0] == 0 )
            {
                pNetActual = Abc_NtkCreateNet( pNtk );
                Vec_PtrPush( pBundle->vNetsActual, Abc_ObjNotCond( pNetActual, fCompl ) );
            }
            else
            {
                // get the actual net
                flag=0;
                pNetActual = Ver_ParseFindNet( pNtk, pWord );
                if ( pNetActual == NULL ) 
                {
                    Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb );
                    if ( nMsb == -1 && nLsb == -1 ) 
                    {
                        Ver_ParseSignalSuffix( pMan, pWord, &nMsb, &nLsb );
                        if ( nMsb == -1 && nLsb == -1 ) 
                        {
                            if ( !strncmp(pWord, "Open_", 5) ||
                                !strncmp(pWord, "dct_unconnected", 15) ) 
                            {
                                pNetActual = Abc_NtkCreateNet( pNtk );
                                Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                            } 
                            else 
                            {
                                sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                Ver_ParsePrintErrorMessage( pMan );
                                return 0;
                            }
                        } 
                        else 
                        {
                            flag=1;
                        }
                    } 
                    else 
                    {
                        flag=1;
                    }
                    if (flag) 
                    {
                        Limit = (nMsb > nLsb) ? nMsb - nLsb + 1: nLsb - nMsb + 1;  
                        for ( Bit = nMsb, k = Limit - 1; k >= 0; Bit = (nMsb > nLsb ? Bit - 1: Bit + 1), k--)
                        {
                            // get the actual net
                            sprintf( Buffer, "%s[%d]", pWord, Bit );
                            pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                            if ( pNetActual == NULL )
                            {
                                if ( !strncmp(pWord, "Open_", 5) ||
                                    !strncmp(pWord, "dct_unconnected", 15)) 
                                    pNetActual = Abc_NtkCreateNet( pNtk );
                                else
                                {
                                    sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                    Ver_ParsePrintErrorMessage( pMan );
                                    return 0;
                                }
                            }
                            Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        }
                    }
                } 
                else 
                {
                    Vec_PtrPush( pBundle->vNetsActual, Abc_ObjNotCond( pNetActual, fCompl ) );
                }
            }
        }

        if ( fFormalIsGiven )
        {
            // close the parenthesis
            Ver_ParseSkipComments( pMan );
            if ( Ver_StreamPopChar(p) != ')' )
            {
                sprintf( pMan->sError, "Cannot parse formal parameter %s of box %s (expected closing parenthesis).", pWord, Abc_ObjName(pNode) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            Ver_ParseSkipComments( pMan );
        }

        // check if it is the end of gate
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ')' )
            break;
        // skip comma
        if ( Symbol != ',' )
        {
            sprintf( pMan->sError, "Cannot parse formal parameter %s of box %s (expected comma).", pWord, Abc_ObjName(pNode) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        Ver_ParseSkipComments( pMan );
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot read box %s (expected closing semicolumn).", Abc_ObjName(pNode) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    return 1;
}